

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

shared_ptr<const_notch::core::ABackpropLayer> __thiscall
notch::core::Net::getLayer(Net *this,size_t i)

{
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_notch::core::ABackpropLayer> sVar1;
  __shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  if (in_RDX < (ulong)(*(long *)(i + 0x10) - *(long *)(i + 8) >> 4)) {
    std::__shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_18,
               (__shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)(i + 8) + in_RDX * 0x10));
  }
  else {
    local_18._M_ptr = (element_type *)0x0;
    local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  ::std::__shared_ptr<notch::core::ABackpropLayer_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<notch::core::ABackpropLayer,void>
            ((__shared_ptr<notch::core::ABackpropLayer_const,(__gnu_cxx::_Lock_policy)2> *)this,
             &local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  sVar1.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_notch::core::ABackpropLayer>)
         sVar1.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const ABackpropLayer> getLayer(size_t i) const {
       return (i < layers.size()) ? layers[i] : nullptr;
    }